

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_intersect(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2)

{
  byte local_29;
  array_container_t *paStack_28;
  uint8_t type2_local;
  container_t *c2_local;
  array_container_t *paStack_18;
  uint8_t type1_local;
  container_t *c1_local;
  
  local_29 = type2;
  paStack_28 = (array_container_t *)c2;
  c2_local._7_1_ = type1;
  paStack_18 = (array_container_t *)c1;
  paStack_18 = (array_container_t *)container_unwrap_shared(c1,(uint8_t *)((long)&c2_local + 7));
  paStack_28 = (array_container_t *)container_unwrap_shared(paStack_28,&local_29);
  switch((local_29 - 5) + (uint)c2_local._7_1_ * 4) {
  case 0:
    c1_local._7_1_ =
         bitset_container_intersect
                   ((bitset_container_t *)paStack_18,(bitset_container_t *)paStack_28);
    break;
  case 1:
    c1_local._7_1_ = array_bitset_container_intersect(paStack_28,(bitset_container_t *)paStack_18);
    break;
  case 2:
    c1_local._7_1_ =
         run_bitset_container_intersect
                   ((run_container_t *)paStack_28,(bitset_container_t *)paStack_18);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x139e,
                  "_Bool container_intersect(const container_t *, uint8_t, const container_t *, uint8_t)"
                 );
  case 4:
    c1_local._7_1_ = array_bitset_container_intersect(paStack_18,(bitset_container_t *)paStack_28);
    break;
  case 5:
    c1_local._7_1_ = array_container_intersect(paStack_18,paStack_28);
    break;
  case 6:
    c1_local._7_1_ = array_run_container_intersect(paStack_18,(run_container_t *)paStack_28);
    break;
  case 8:
    c1_local._7_1_ =
         run_bitset_container_intersect
                   ((run_container_t *)paStack_18,(bitset_container_t *)paStack_28);
    break;
  case 9:
    c1_local._7_1_ = array_run_container_intersect(paStack_28,(run_container_t *)paStack_18);
    break;
  case 10:
    c1_local._7_1_ =
         run_container_intersect((run_container_t *)paStack_18,(run_container_t *)paStack_28);
  }
  return c1_local._7_1_;
}

Assistant:

static inline bool container_intersect(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            return bitset_container_intersect(const_CAST_bitset(c1),
                                              const_CAST_bitset(c2));

        case CONTAINER_PAIR(ARRAY,ARRAY):
            return array_container_intersect(const_CAST_array(c1),
                                             const_CAST_array(c2));

        case CONTAINER_PAIR(RUN,RUN):
            return run_container_intersect(const_CAST_run(c1),
                                           const_CAST_run(c2));

        case CONTAINER_PAIR(BITSET,ARRAY):
            return array_bitset_container_intersect(const_CAST_array(c2),
                                                    const_CAST_bitset(c1));

        case CONTAINER_PAIR(ARRAY,BITSET):
            return array_bitset_container_intersect(const_CAST_array(c1),
                                                    const_CAST_bitset(c2));

        case CONTAINER_PAIR(BITSET,RUN):
            return run_bitset_container_intersect(const_CAST_run(c2),
                                                  const_CAST_bitset(c1));

        case CONTAINER_PAIR(RUN,BITSET):
            return run_bitset_container_intersect(const_CAST_run(c1),
                                                  const_CAST_bitset(c2));

        case CONTAINER_PAIR(ARRAY,RUN):
            return array_run_container_intersect(const_CAST_array(c1),
                                                 const_CAST_run(c2));

        case CONTAINER_PAIR(RUN,ARRAY):
            return array_run_container_intersect(const_CAST_array(c2),
                                                 const_CAST_run(c1));

        default:
            assert(false);
            __builtin_unreachable();
            return 0;
    }
}